

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O0

char * parse_float(char *ptr,float *val)

{
  char cVar1;
  int iVar2;
  double local_58;
  double *local_48;
  double *powers;
  double dStack_38;
  uint eval;
  double div;
  double fra;
  double num;
  double sign;
  float *val_local;
  char *ptr_local;
  
  val_local = (float *)skip_whitespace(ptr);
  if (*(char *)val_local == '+') {
    num = 1.0;
    val_local = (float *)((long)val_local + 1);
  }
  else if (*(char *)val_local == '-') {
    num = -1.0;
    val_local = (float *)((long)val_local + 1);
  }
  else {
    num = 1.0;
  }
  fra = 0.0;
  while( true ) {
    iVar2 = is_digit(*(char *)val_local);
    if (iVar2 == 0) break;
    fra = fra * 10.0 + (double)(*(char *)val_local + -0x30);
    val_local = (float *)((long)val_local + 1);
  }
  if (*(char *)val_local == '.') {
    val_local = (float *)((long)val_local + 1);
  }
  div = 0.0;
  dStack_38 = 1.0;
  while( true ) {
    iVar2 = is_digit(*(char *)val_local);
    if (iVar2 == 0) break;
    div = div * 10.0 + (double)(*(char *)val_local + -0x30);
    dStack_38 = dStack_38 * 10.0;
    val_local = (float *)((long)val_local + 1);
  }
  fra = div / dStack_38 + fra;
  iVar2 = is_exponent(*(char *)val_local);
  if (iVar2 != 0) {
    cVar1 = *(char *)((long)val_local + 1);
    if (cVar1 == '+') {
      local_48 = POWER_10_POS;
      val_local = (float *)((long)val_local + 2);
    }
    else if (cVar1 == '-') {
      local_48 = POWER_10_NEG;
      val_local = (float *)((long)val_local + 2);
    }
    else {
      local_48 = POWER_10_POS;
      val_local = (float *)((long)val_local + 1);
    }
    powers._4_4_ = 0;
    while( true ) {
      iVar2 = is_digit(*(char *)val_local);
      if (iVar2 == 0) break;
      powers._4_4_ = powers._4_4_ * 10 + *(char *)val_local + -0x30;
      val_local = (float *)((long)val_local + 1);
    }
    if (powers._4_4_ < 0x14) {
      local_58 = local_48[powers._4_4_];
    }
    else {
      local_58 = 0.0;
    }
    fra = local_58 * fra;
  }
  *val = (float)(num * fra);
  return (char *)val_local;
}

Assistant:

static
const char* parse_float(const char* ptr, float* val)
{
   double        sign;
   double        num;
   double        fra;
   double        div;
   unsigned int  eval;
   const double* powers;


   ptr = skip_whitespace(ptr);

   switch (*ptr)
   {
   case '+':
       sign = 1.0;
       ptr++;
       break;

   case '-':
       sign = -1.0;
       ptr++;
       break;

   default:
       sign = 1.0;
       break;
   }


   num = 0.0;
   while (is_digit(*ptr))
       num = 10.0 * num + (double)(*ptr++ - '0');

   if (*ptr == '.')
       ptr++;

   fra = 0.0;
   div = 1.0;

   while (is_digit(*ptr))
   {
       fra  = 10.0 * fra + (double)(*ptr++ - '0');
       div *= 10.0;
   }

   num += fra / div;

   if (is_exponent(*ptr))
   {
       ptr++;

       switch (*ptr)
       {
       case '+':
           powers = POWER_10_POS;
           ptr++;
           break;

       case '-':
           powers = POWER_10_NEG;
           ptr++;
           break;

       default:
           powers = POWER_10_POS;
           break;
       }

       eval = 0;
       while (is_digit(*ptr))
           eval = 10 * eval + (*ptr++ - '0');

       num *= (eval >= MAX_POWER) ? 0.0 : powers[eval];
   }

   *val = (float)(sign * num);

   return ptr;
}